

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O2

void __thiscall
World_3df::breed(World_3df *this,shared_ptr<Population> *param_1,shared_ptr<Population> *dst)

{
  long lVar1;
  type pFVar2;
  type pPVar3;
  creat_t *pcVar4;
  type pCVar5;
  uint64_t uVar6;
  size_t val;
  Msg local_420;
  Msg local_3f0;
  Msg local_3c0;
  Msg local_390;
  Msg local_360;
  Msg local_330;
  Msg local_300;
  Msg local_2d0;
  Msg local_2a0;
  Msg local_270;
  Msg local_240;
  Msg local_210;
  Msg local_1e0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  Msg local_d0;
  Msg local_a0;
  uint64_t local_70;
  double local_68;
  double local_60;
  shared_ptr<util::logging::File_logger> local_58;
  World_3df *local_48;
  long local_40;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  local_a0._vptr_Msg = (_func_int **)(this->super_World).LOGFILE.px;
  local_a0.msg_txt._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_a0.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_a0.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_a0.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  local_48 = this;
  pFVar2 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&local_a0);
  util::logging::Msg::Msg(&local_d0,anon_var_dwarf_33f33,L_NORM);
  (*(pFVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar2,&local_d0);
  util::logging::Msg::~Msg(&local_d0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_a0.msg_txt);
  pPVar3 = boost::shared_ptr<Population>::operator->(dst);
  val = pPVar3->ELITE_SIZE;
  local_40 = val << 4;
  while( true ) {
    pPVar3 = boost::shared_ptr<Population>::operator->(dst);
    pcVar4 = Population::get_creatures(pPVar3);
    if (((long)(pcVar4->
               super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(pcVar4->
               super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 4) - 1U <= val) break;
    pPVar3 = boost::shared_ptr<Population>::operator->(dst);
    pcVar4 = Population::get_creatures(pPVar3);
    lVar1 = local_40;
    pCVar5 = boost::shared_ptr<Creature>::operator->
                       ((shared_ptr<Creature> *)
                        ((long)&((pcVar4->
                                 super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->px + local_40));
    local_68 = pCVar5->fitness;
    pPVar3 = boost::shared_ptr<Population>::operator->(dst);
    pcVar4 = Population::get_creatures(pPVar3);
    pCVar5 = boost::shared_ptr<Creature>::operator->
                       ((shared_ptr<Creature> *)
                        ((long)&(pcVar4->
                                super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[1].px + lVar1));
    local_60 = pCVar5->fitness;
    uVar6 = frand(0x31);
    pPVar3 = boost::shared_ptr<Population>::operator->(dst);
    local_70 = uVar6;
    (*pPVar3->_vptr_Population[3])(pPVar3,val,val + 1,uVar6);
    local_58.px = (local_48->super_World).LOGFILE.px;
    local_58.pn.pi_ = (local_48->super_World).LOGFILE.pn.pi_;
    if (local_58.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_58.pn.pi_)->use_count_ = (local_58.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    pFVar2 = boost::shared_ptr<util::logging::File_logger>::operator*(&local_58);
    util::logging::Msg::Msg(&local_360,"... [",L_NORM);
    util::logging::Msg::operator+(&local_1e0,&local_360,val);
    std::__cxx11::string::string((string *)&local_1b0,"]x[",&local_37);
    util::logging::Msg::operator+(&local_390,&local_1e0,&local_1b0);
    util::logging::Msg::operator+(&local_210,&local_390,val + 1);
    std::__cxx11::string::string((string *)&local_190,"]@",&local_36);
    util::logging::Msg::operator+(&local_3c0,&local_210,&local_190);
    util::logging::Msg::operator+(&local_240,&local_3c0,local_70);
    std::__cxx11::string::string((string *)&local_170," = {f1: ",&local_35);
    util::logging::Msg::operator+(&local_3f0,&local_240,&local_170);
    util::logging::Msg::operator+(&local_270,&local_3f0,local_68);
    std::__cxx11::string::string((string *)&local_150," -> ",&local_34);
    util::logging::Msg::operator+(&local_2a0,&local_270,&local_150);
    pPVar3 = boost::shared_ptr<Population>::operator->(dst);
    pcVar4 = Population::get_creatures(pPVar3);
    pCVar5 = boost::shared_ptr<Creature>::operator->
                       ((shared_ptr<Creature> *)
                        ((long)&((pcVar4->
                                 super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->px + local_40));
    util::logging::Msg::operator+(&local_2d0,&local_2a0,pCVar5->fitness);
    std::__cxx11::string::string((string *)&local_130,"}x{f2: ",&local_33);
    util::logging::Msg::operator+(&local_420,&local_2d0,&local_130);
    util::logging::Msg::operator+(&local_300,&local_420,local_60);
    std::__cxx11::string::string((string *)&local_110," -> ",&local_32);
    util::logging::Msg::operator+(&local_330,&local_300,&local_110);
    pPVar3 = boost::shared_ptr<Population>::operator->(dst);
    pcVar4 = Population::get_creatures(pPVar3);
    pCVar5 = boost::shared_ptr<Creature>::operator->
                       ((shared_ptr<Creature> *)
                        ((long)&(pcVar4->
                                super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[1].px + local_40));
    util::logging::Msg::operator+(&local_a0,&local_330,pCVar5->fitness);
    std::__cxx11::string::string((string *)&local_f0,"}",&local_31);
    util::logging::Msg::operator+(&local_d0,&local_a0,&local_f0);
    (*(pFVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar2,&local_d0);
    util::logging::Msg::~Msg(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    util::logging::Msg::~Msg(&local_a0);
    util::logging::Msg::~Msg(&local_330);
    std::__cxx11::string::~string((string *)&local_110);
    util::logging::Msg::~Msg(&local_300);
    util::logging::Msg::~Msg(&local_420);
    std::__cxx11::string::~string((string *)&local_130);
    util::logging::Msg::~Msg(&local_2d0);
    util::logging::Msg::~Msg(&local_2a0);
    std::__cxx11::string::~string((string *)&local_150);
    util::logging::Msg::~Msg(&local_270);
    util::logging::Msg::~Msg(&local_3f0);
    std::__cxx11::string::~string((string *)&local_170);
    util::logging::Msg::~Msg(&local_240);
    util::logging::Msg::~Msg(&local_3c0);
    std::__cxx11::string::~string((string *)&local_190);
    util::logging::Msg::~Msg(&local_210);
    util::logging::Msg::~Msg(&local_390);
    std::__cxx11::string::~string((string *)&local_1b0);
    util::logging::Msg::~Msg(&local_1e0);
    util::logging::Msg::~Msg(&local_360);
    boost::detail::shared_count::~shared_count(&local_58.pn);
    local_40 = local_40 + 0x20;
    val = val + 2;
  }
  local_a0._vptr_Msg = (_func_int **)(local_48->super_World).LOGFILE.px;
  local_a0.msg_txt._M_dataplus._M_p = (pointer)(local_48->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_a0.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_a0.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_a0.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  pFVar2 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&local_a0);
  util::logging::Msg::Msg(&local_d0,anon_var_dwarf_33f1d,L_NORM);
  (*(pFVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar2,&local_d0);
  util::logging::Msg::~Msg(&local_d0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_a0.msg_txt);
  return;
}

Assistant:

void World_3df::breed( shared_ptr<Population>&, boost::shared_ptr<Population>& dst )
{

	(*get_log()) << "Krzyżowanie...";

	/*
	 * First  ELITE_SIZE is elite, so we live it alone
	 *
	 * If crits count isn't even, we leave one out
	 */
	size_t i = dst->ELITE_SIZE;
	while(i < (dst->get_creatures().size() - 1))
	{
		double m1 = dst->get_creatures()[i]->get_fitness(), m2 = dst->get_creatures()[i + 1]->get_fitness();
		size_t xpnt = frand(CHROMSIZE - 1);
		dst->breed_creatures(i, i + 1, xpnt);

		(*get_log()) << util::logging::Msg("... [") + static_cast<long long> (i) + "]x[" + static_cast<long long> (i
				+ 1) + "]@" + static_cast<long long> (xpnt) + " = {f1: " + m1 + " -> "
				+ dst->get_creatures()[i]->get_fitness() + "}x{f2: " + m2 + " -> "
				+ dst->get_creatures()[i + 1]->get_fitness() + "}";
		i += 2;
	}

	(*get_log()) << "Już";
}